

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapped_handler.hpp
# Opt level: O0

asio_handler_allocate_is_deprecated
asio::detail::
asio_handler_allocate<asio::io_context::strand,fineftp::FtpSession::startSendingMessages()::__0,asio::detail::is_continuation_if_running>
          (size_t size,
          wrapped_handler<asio::io_context::strand,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_asio::detail::is_continuation_if_running>
          *this_handler)

{
  void *pvVar1;
  wrapped_handler<asio::io_context::strand,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_asio::detail::is_continuation_if_running>
  *this_handler_local;
  size_t size_local;
  
  pvVar1 = asio_handler_alloc_helpers::allocate<fineftp::FtpSession::startSendingMessages()::__0>
                     (size,&this_handler->handler_);
  return pvVar1;
}

Assistant:

inline asio_handler_allocate_is_deprecated
asio_handler_allocate(std::size_t size,
    wrapped_handler<Dispatcher, Handler, IsContinuation>* this_handler)
{
#if defined(ASIO_NO_DEPRECATED)
  asio_handler_alloc_helpers::allocate(size, this_handler->handler_);
  return asio_handler_allocate_is_no_longer_used();
#else // defined(ASIO_NO_DEPRECATED)
  return asio_handler_alloc_helpers::allocate(
      size, this_handler->handler_);
#endif // defined(ASIO_NO_DEPRECATED)
}